

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::GridMeshNode::setMaterial
          (GridMeshNode *this,Ref<embree::SceneGraph::MaterialNode> *material)

{
  long *plVar1;
  long *in_RSI;
  long in_RDI;
  
  plVar1 = (long *)(in_RDI + 0xa0);
  if (*in_RSI != 0) {
    (**(code **)(*(long *)*in_RSI + 0x10))();
  }
  if (*plVar1 != 0) {
    (**(code **)(*(long *)*plVar1 + 0x18))();
  }
  *plVar1 = *in_RSI;
  return;
}

Assistant:

virtual void setMaterial(Ref<MaterialNode> material) {
        this->material = material;
      }